

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmmersenne.h
# Opt level: O3

void __thiscall CVmMT19937::seed(CVmMT19937 *this,char *buf,size_t len)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  int mul;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  
  this->mt[0] = 0x12bd6aa;
  this->idx = 1;
  iVar2 = 1;
  do {
    this->mt[iVar2] =
         (this->mt[(long)iVar2 + -1] >> 0x1e ^ this->mt[(long)iVar2 + -1]) * 0x6c078965 + iVar2;
    iVar4 = this->idx;
    iVar2 = iVar4 + 1;
    this->idx = iVar2;
  } while (iVar4 < 0x26f);
  uVar1 = len + 3 >> 2;
  uVar3 = len & 0xfffffffffffffffc;
  iVar2 = 0;
  if (uVar3 != len && len < (len + 3 & 0xfffffffffffffffc)) {
    iVar4 = 1;
    iVar2 = 0;
    do {
      iVar2 = iVar2 + buf[uVar3] * iVar4;
      uVar3 = uVar3 + 1;
      iVar4 = iVar4 << 8;
    } while (uVar3 < len);
  }
  uVar3 = 0x270;
  if (0x270 < uVar1) {
    uVar3 = uVar1;
  }
  iVar4 = 1;
  if ((int)uVar3 != 0) {
    iVar6 = 0;
    do {
      iVar7 = iVar2;
      if (iVar6 * 4 + 4 <= (int)len) {
        iVar7 = *(int *)(buf + (long)iVar6 * 4);
      }
      this->mt[iVar4] =
           iVar7 + iVar6 +
           ((this->mt[(long)iVar4 + -1] >> 0x1e ^ this->mt[(long)iVar4 + -1]) * 0x19660d ^
           this->mt[iVar4]);
      if (iVar4 < 0x26f) {
        iVar4 = iVar4 + 1;
      }
      else {
        this->mt[0] = this->mt[0x26f];
        iVar4 = 1;
      }
      iVar6 = iVar6 + 1;
      if ((int)uVar1 <= iVar6) {
        iVar6 = 0;
      }
      uVar5 = (int)uVar3 - 1;
      uVar3 = (ulong)uVar5;
    } while (uVar5 != 0);
  }
  iVar2 = -0x26f;
  do {
    this->mt[iVar4] =
         ((this->mt[(long)iVar4 + -1] >> 0x1e ^ this->mt[(long)iVar4 + -1]) * 0x5d588b65 ^
         this->mt[iVar4]) - iVar4;
    if (iVar4 < 0x26f) {
      iVar4 = iVar4 + 1;
    }
    else {
      this->mt[0] = this->mt[0x26f];
      iVar4 = 1;
    }
    iVar2 = iVar2 + 1;
  } while (iVar2 != 0);
  this->mt[0] = 0x80000000;
  this->idx = 0;
  iVar2 = 0x271;
  do {
    rand(this);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  return;
}

Assistant:

void seed(const char *buf, size_t len)
    {
        /*
         *   Use the mechanism from the reference implementation for seeding
         *   from multiple values.  First do a fixed seeding of the mt array
         *   to fill it with nonzero bits. 
         */
        base_seed(19650218);

        /* treat the source as an array of int32s */
        size_t icnt = (len + 3)/4;

        /* if there's a partial int32 at the end, figure its value */
        uint32_t partial = 0;
        if (icnt*4 > len)
        {
            int mul = 1;
            for (size_t i = (len/4)*4 ; i < len ; ++i, mul *= 256)
                partial += buf[i]*mul;
        }

        /* 
         *   do a pass over the mt array, doing the sort of LCG
         *   initialization we do with a single int seed, but folding each
         *   seed value into the running LCG feedback register
         */
        int i = 1, j = 0, k = NMT > icnt ? NMT : icnt;
        for ( ; k != 0 ; --k)
        {
            /* get the current seed (the last one might be partial) */
            uint32_t seed = (j+1)*4 <= (int)len ? osrp4(buf + j*4) : partial;
           
            /* generate an LCG value mixing in this seed value */
            mt[i] = (mt[i] ^ ((mt[i-1] ^ (mt[i-1] >> 30)) * 0x19660D))
                    + seed + j;

            /* on to the next mt index, wrapping at the end */
            if (++i >= NMT)
            {
                mt[0] = mt[NMT-1];
                i = 1;
            }

            /* on to the next seed index, wrapping at the end */
            if (++j >= (int)icnt)
                j = 0;
        }

        /* make another pass over the mt array */
        for (k = NMT-1 ; k != 0 ; --k)
        {
            mt[i] = (mt[i] ^ ((mt[i-1] ^ (mt[i-1] >> 30)) * 0x5D588B65)) - i;
            if (++i >= NMT)
            {
                mt[0] = mt[NMT-1];
                i = 1;
            }
        }

        /* and finally, make sure the initial array isn't all zeros */
        mt[0] = 0x80000000UL;

        /* flush out the first full mt array */
        idx = 0;
        for (i = 0 ; i <= NMT ; ++i)
            rand();
    }